

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

inform_pid_source ** sources(size_t n,inform_error *err)

{
  size_t *m_00;
  size_t *name;
  inform_pid_source *x;
  inform_pid_source **srcs_00;
  inform_pid_source **ts;
  inform_pid_source **ts_1;
  inform_pid_source *src;
  size_t *c;
  size_t i;
  inform_pid_source **srcs;
  size_t m;
  inform_error *err_local;
  size_t n_local;
  
  if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
    n_local = 0;
  }
  else {
    m_00 = (size_t *)(long)((1 << ((byte)n & 0x1f)) + -1);
    i = (size_t)gvector_alloc(0,0,8);
    if ((gvector)i == (gvector)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      n_local = 0;
    }
    else {
      for (c = (size_t *)0x1; c <= m_00; c = (size_t *)((long)c + 1)) {
        name = (size_t *)gvector_alloc(1,1,8);
        if (name == (size_t *)0x0) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          return (inform_pid_source **)0x0;
        }
        *name = (size_t)c;
        x = alloc_source(name,err);
        if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) {
          gvector_free(name);
          return (inform_pid_source **)0x0;
        }
        srcs_00 = push_source((inform_pid_source **)i,x);
        if (srcs_00 == (inform_pid_source **)0x0) {
          free_source(x);
          free_all_sources((inform_pid_source **)i);
          gvector_free(name);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          return (inform_pid_source **)0x0;
        }
        i = (size_t)sources_rec((long)c + 1,(size_t)m_00,name,srcs_00,err);
        if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) {
          free_all_sources((inform_pid_source **)i);
          return (inform_pid_source **)0x0;
        }
      }
      n_local = (size_t)gvector_shrink((gvector)i);
      if ((gvector)n_local == (gvector)0x0) {
        free_all_sources((inform_pid_source **)i);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        n_local = 0;
      }
    }
  }
  return (inform_pid_source **)n_local;
}

Assistant:

static inform_pid_source **sources(size_t n, inform_error *err)
{
    if (n < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NULL);
    }
    size_t const m = (1 << n) - 1;
    inform_pid_source **srcs = gvector_alloc(0, 0, sizeof(inform_pid_source*));
    if (!srcs)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 1; i <= m; ++i)
    {
        size_t *c = gvector_alloc(1, 1, sizeof(size_t));
        if (!c)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        c[0] = i;

        inform_pid_source *src = alloc_source(c, err);
        if (FAILED(err))
        {
            gvector_free(c);
            return NULL;
        }

        inform_pid_source **ts = push_source(srcs, src);
        if (!ts)
        {
            free_source(src);
            free_all_sources(srcs);
            gvector_free(c);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        srcs = ts;

        srcs = sources_rec(i + 1, m, c, srcs, err);
        if (FAILED(err))
        {
            free_all_sources(srcs);
            return NULL;
        }
    }

    inform_pid_source **ts = gvector_shrink(srcs);
    if (!ts)
    {
        free_all_sources(srcs);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    return ts;
}